

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O1

int fits_img_stats_short
              (short *array,long nx,long ny,int nullcheck,short nullvalue,long *ngoodpix,
              short *minvalue,short *maxvalue,double *mean,double *sigma,double *noise1,
              double *noise2,double *noise3,double *noise5,int *status)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  short sVar8;
  short sVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  long ii;
  ulong uVar13;
  void *__ptr;
  double *pdVar14;
  ulong uVar15;
  double *arr;
  double *arr_00;
  double *__ptr_00;
  double *__base;
  double *__base_00;
  size_t sVar16;
  size_t sVar17;
  long lVar18;
  ushort uVar19;
  long lVar20;
  short *psVar21;
  short sVar22;
  uint uVar23;
  short sVar24;
  uint uVar25;
  ulong uVar26;
  int iVar27;
  short *psVar28;
  long lVar29;
  size_t sVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  size_t __nmemb;
  short sVar34;
  uint uVar35;
  int iVar36;
  size_t __nmemb_00;
  int iVar37;
  ulong uVar38;
  uint uVar39;
  bool bVar40;
  double dVar41;
  double dVar42;
  short *value;
  size_t local_f0;
  uint local_c4;
  uint local_a8;
  uint local_a4;
  size_t local_a0;
  long local_88;
  double dStack_70;
  long local_60;
  size_t local_58;
  uint local_4c;
  
  uVar26 = nx;
  if (mean != (double *)0x0 || sigma != (double *)0x0) {
    uVar13 = ny * nx;
    if (nullcheck == 0) {
      if ((long)uVar13 < 1) goto LAB_001b43fb;
      dVar41 = 0.0;
      lVar29 = 0;
      dVar42 = 0.0;
      do {
        dVar7 = (double)(int)array[lVar29];
        dVar42 = dVar42 + dVar7;
        dVar41 = dVar41 + dVar7 * dVar7;
        lVar29 = lVar29 + 1;
        uVar26 = uVar13;
      } while (uVar13 - lVar29 != 0);
    }
    else if ((long)uVar13 < 1) {
      uVar13 = 0;
LAB_001b43fb:
      dVar42 = 0.0;
      dVar41 = 0.0;
      uVar26 = uVar13;
    }
    else {
      dVar41 = 0.0;
      uVar26 = 0;
      dVar42 = 0.0;
      lVar29 = 0;
      do {
        if (array[lVar29] != nullvalue) {
          dVar7 = (double)(int)array[lVar29];
          uVar26 = uVar26 + 1;
          dVar42 = dVar42 + dVar7;
          dVar41 = dVar41 + dVar7 * dVar7;
        }
        lVar29 = lVar29 + 1;
      } while (uVar13 - lVar29 != 0);
    }
    if ((long)uVar26 < 2) {
      dVar41 = 0.0;
      bVar40 = uVar26 == 1;
      uVar26 = (ulong)bVar40;
      if (!bVar40) {
        dVar42 = 0.0;
      }
    }
    else {
      dVar42 = dVar42 / (double)(long)uVar26;
      dVar41 = dVar41 / (double)(long)uVar26 - dVar42 * dVar42;
      if (dVar41 < 0.0) {
        dVar41 = sqrt(dVar41);
      }
      else {
        dVar41 = SQRT(dVar41);
      }
    }
    if (ngoodpix != (long *)0x0) {
      *ngoodpix = uVar26;
    }
    if (mean != (double *)0x0) {
      *mean = dVar42;
    }
    if (sigma != (double *)0x0) {
      *sigma = dVar41;
    }
  }
  if (noise1 != (double *)0x0) {
    dVar41 = 0.0;
    if (2 < nx) {
      __ptr = calloc(nx,2);
      if (__ptr != (void *)0x0) {
        pdVar14 = (double *)calloc(ny,8);
        if (pdVar14 != (double *)0x0) {
          if (ny < 1) {
            local_f0 = 0;
          }
          else {
            local_f0 = 0;
            lVar29 = 0;
            psVar28 = array;
            do {
              lVar20 = 0;
              lVar18 = lVar20;
              if (nullcheck != 0) {
                do {
                  lVar18 = lVar20;
                  if (psVar28[lVar20] != nullvalue) break;
                  lVar20 = lVar20 + 1;
                  lVar18 = nx;
                } while (nx != lVar20);
              }
              if (lVar18 != nx) {
                lVar20 = lVar18 + 1;
                if (lVar20 < nx) {
                  psVar21 = array + lVar29 * nx + lVar18;
                  uVar13 = 0;
                  do {
                    lVar18 = lVar20;
                    if ((nullcheck != 0) && (lVar20 < nx)) {
                      do {
                        lVar18 = lVar20;
                        if (psVar28[lVar20] != nullvalue) break;
                        lVar20 = lVar20 + 1;
                        lVar18 = nx;
                      } while (nx != lVar20);
                    }
                    if (lVar18 == nx) break;
                    sVar34 = *psVar21;
                    psVar21 = array + lVar29 * nx + lVar18;
                    *(short *)((long)__ptr + uVar13 * 2) = sVar34 - *psVar21;
                    uVar13 = uVar13 + 1;
                    lVar20 = lVar18 + 1;
                  } while (lVar20 < nx);
                }
                else {
                  uVar13 = 0;
                }
                if (1 < uVar13) {
                  dVar41 = 0.0;
                  dVar42 = 0.0;
                  uVar15 = 0;
                  do {
                    dVar7 = (double)(int)*(short *)((long)__ptr + uVar15 * 2);
                    dVar42 = dVar42 + dVar7;
                    dVar41 = dVar41 + dVar7 * dVar7;
                    uVar15 = uVar15 + 1;
                  } while (uVar13 != uVar15);
                  dVar42 = dVar42 / (double)(long)uVar13;
                  dVar41 = dVar41 / (double)(long)uVar13 - dVar42 * dVar42;
                  if (dVar41 < 0.0) {
                    dVar41 = sqrt(dVar41);
                  }
                  else {
                    dVar41 = SQRT(dVar41);
                  }
                  if (0.0 < dVar41) {
                    iVar36 = 0;
                    do {
                      if ((long)uVar13 < 1) {
                        uVar38 = 0;
                      }
                      else {
                        uVar15 = 0;
                        uVar38 = 0;
                        do {
                          sVar34 = *(short *)((long)__ptr + uVar15 * 2);
                          if (ABS((double)(int)sVar34 - dVar42) < dVar41 * 5.0) {
                            if ((long)uVar38 < (long)uVar15) {
                              *(short *)((long)__ptr + uVar38 * 2) = sVar34;
                            }
                            uVar38 = uVar38 + 1;
                          }
                          uVar15 = uVar15 + 1;
                        } while (uVar13 != uVar15);
                      }
                      if (uVar38 == uVar13) break;
                      if ((long)uVar38 < 1) {
                        dVar42 = 0.0;
                        dVar41 = 0.0;
                      }
                      else {
                        dVar41 = 0.0;
                        dVar42 = 0.0;
                        uVar13 = 0;
                        do {
                          dVar7 = (double)(int)*(short *)((long)__ptr + uVar13 * 2);
                          dVar42 = dVar42 + dVar7;
                          dVar41 = dVar41 + dVar7 * dVar7;
                          uVar13 = uVar13 + 1;
                        } while (uVar38 != uVar13);
                      }
                      if ((long)uVar38 < 2) {
                        dVar41 = 0.0;
                        if (uVar38 != 1) {
                          dVar42 = 0.0;
                        }
                      }
                      else {
                        dVar42 = dVar42 / (double)(long)uVar38;
                        dVar41 = dVar41 / (double)(long)uVar38 - dVar42 * dVar42;
                        if (dVar41 < 0.0) {
                          dVar41 = sqrt(dVar41);
                        }
                        else {
                          dVar41 = SQRT(dVar41);
                        }
                      }
                      iVar36 = iVar36 + 1;
                      uVar13 = uVar38;
                    } while (iVar36 != 3);
                  }
                  pdVar14[local_f0] = dVar41;
                  local_f0 = local_f0 + 1;
                }
              }
              lVar29 = lVar29 + 1;
              psVar28 = psVar28 + nx;
            } while (lVar29 != ny);
          }
          if (local_f0 == 0) {
            dVar41 = 0.0;
          }
          else if (local_f0 == 1) {
            dVar41 = *pdVar14;
          }
          else {
            qsort(pdVar14,local_f0,8,FnCompare_double);
            dVar41 = (*(double *)
                       ((long)pdVar14 +
                       ((local_f0 - ((long)(local_f0 - 1) >> 0x3f)) - 1 & 0xfffffffffffffffe) * 4) +
                     *(double *)
                      ((long)pdVar14 +
                      (local_f0 - ((long)local_f0 >> 0x3f) & 0xfffffffffffffffe) * 4)) * 0.5;
          }
          dVar41 = dVar41 * 0.70710678;
          free(pdVar14);
          free(__ptr);
          goto LAB_001b48cb;
        }
        free(__ptr);
      }
      *status = 0x71;
      dVar41 = 0.0;
    }
LAB_001b48cb:
    *noise1 = dVar41;
  }
  if ((minvalue == (short *)0x0 && maxvalue == (short *)0x0) && noise3 == (double *)0x0)
  goto LAB_001b5153;
  lVar29 = 1;
  __nmemb = ny;
  if (nx < 9) {
    __nmemb = 1;
    lVar29 = ny;
  }
  __nmemb_00 = lVar29 * nx;
  if ((long)__nmemb_00 < 9) {
    dVar41 = 0.0;
    dStack_70 = 0.0;
    dVar42 = 0.0;
    if ((long)__nmemb_00 < 1) {
      sVar34 = -0x8000;
      sVar22 = 0x7fff;
      uVar26 = 0;
      dVar42 = 0.0;
    }
    else {
      sVar22 = 0x7fff;
      lVar29 = 0;
      uVar26 = 0;
      sVar24 = -0x8000;
      do {
        if ((nullcheck == 0) || (sVar34 = sVar24, array[lVar29] != nullvalue)) {
          sVar34 = array[lVar29];
          if (sVar34 < sVar22) {
            sVar22 = sVar34;
          }
          if (sVar34 <= sVar24) {
            sVar34 = sVar24;
          }
          uVar26 = uVar26 + 1;
        }
        lVar29 = lVar29 + 1;
        sVar24 = sVar34;
      } while (__nmemb_00 - lVar29 != 0);
    }
  }
  else {
    pdVar14 = (double *)calloc(__nmemb_00,4);
    if (pdVar14 != (double *)0x0) {
      arr = (double *)calloc(__nmemb_00,4);
      if (arr != (double *)0x0) {
        arr_00 = (double *)calloc(__nmemb_00,4);
        if (arr_00 == (double *)0x0) {
          free(pdVar14);
          pdVar14 = arr;
        }
        else {
          __ptr_00 = (double *)calloc(__nmemb,8);
          if (__ptr_00 == (double *)0x0) {
            free(pdVar14);
            free(arr);
            pdVar14 = arr_00;
          }
          else {
            __base = (double *)calloc(__nmemb,8);
            if (__base == (double *)0x0) {
              free(pdVar14);
              free(arr);
              free(arr_00);
              pdVar14 = __ptr_00;
            }
            else {
              __base_00 = (double *)calloc(__nmemb,8);
              if (__base_00 != (double *)0x0) {
                if ((long)__nmemb < 1) {
                  sVar34 = -0x8000;
                  sVar22 = 0x7fff;
                  uVar26 = 0;
                  local_a0 = 0;
                  local_58 = 0;
                }
                else {
                  uVar23 = 0x7fff;
                  sVar30 = 0;
                  local_58 = 0;
                  local_a0 = 0;
                  uVar26 = 0;
                  psVar28 = array;
                  uVar33 = 0x8000;
                  do {
                    sVar16 = 0;
                    sVar17 = sVar16;
                    if (nullcheck != 0) {
                      do {
                        sVar17 = sVar16;
                        if (psVar28[sVar16] != nullvalue) break;
                        sVar16 = sVar16 + 1;
                        sVar17 = __nmemb_00;
                      } while (__nmemb_00 - sVar16 != 0);
                    }
                    uVar35 = uVar33;
                    if (sVar17 != __nmemb_00) {
                      lVar18 = sVar30 * __nmemb_00;
                      uVar19 = array[lVar18 + sVar17];
                      if ((short)uVar19 < (short)uVar23) {
                        uVar23 = (uint)uVar19;
                      }
                      uVar35 = (uint)uVar19;
                      if ((short)uVar19 <= (short)uVar33) {
                        uVar35 = uVar33;
                      }
                      sVar17 = sVar17 + 1;
                      sVar16 = sVar17;
                      if ((nullcheck != 0) && ((long)sVar17 < (long)__nmemb_00)) {
                        do {
                          sVar16 = sVar17;
                          if (psVar28[sVar17] != nullvalue) break;
                          sVar17 = sVar17 + 1;
                          sVar16 = __nmemb_00;
                        } while (__nmemb_00 - sVar17 != 0);
                      }
                      if (sVar16 == __nmemb_00) {
                        uVar26 = uVar26 + 1;
                      }
                      else {
                        uVar1 = array[lVar18 + sVar16];
                        if ((short)uVar1 < (short)uVar23) {
                          uVar23 = (uint)uVar1;
                        }
                        uVar33 = (uint)uVar1;
                        if ((short)uVar1 <= (short)uVar35) {
                          uVar33 = uVar35;
                        }
                        uVar35 = uVar33;
                        sVar16 = sVar16 + 1;
                        sVar17 = sVar16;
                        if ((nullcheck != 0) && ((long)sVar16 < (long)__nmemb_00)) {
                          do {
                            sVar17 = sVar16;
                            if (psVar28[sVar16] != nullvalue) break;
                            sVar16 = sVar16 + 1;
                            sVar17 = __nmemb_00;
                          } while (__nmemb_00 - sVar16 != 0);
                        }
                        if (sVar17 == __nmemb_00) {
                          uVar26 = uVar26 + 2;
                        }
                        else {
                          uVar2 = array[lVar18 + sVar17];
                          if ((short)uVar2 < (short)uVar23) {
                            uVar23 = (uint)uVar2;
                          }
                          uVar33 = (uint)uVar2;
                          if ((short)uVar2 <= (short)uVar35) {
                            uVar33 = uVar35;
                          }
                          uVar35 = uVar33;
                          sVar17 = sVar17 + 1;
                          sVar16 = sVar17;
                          if ((nullcheck != 0) && ((long)sVar17 < (long)__nmemb_00)) {
                            do {
                              sVar16 = sVar17;
                              if (psVar28[sVar17] != nullvalue) break;
                              sVar17 = sVar17 + 1;
                              sVar16 = __nmemb_00;
                            } while (__nmemb_00 - sVar17 != 0);
                          }
                          if (sVar16 == __nmemb_00) {
                            uVar26 = uVar26 + 3;
                          }
                          else {
                            uVar3 = array[lVar18 + sVar16];
                            local_c4 = (uint)uVar3;
                            if ((short)uVar3 < (short)uVar23) {
                              uVar23 = (uint)uVar3;
                            }
                            uVar33 = local_c4;
                            if ((short)uVar3 <= (short)uVar35) {
                              uVar33 = uVar35;
                            }
                            uVar35 = uVar33;
                            sVar16 = sVar16 + 1;
                            sVar17 = sVar16;
                            if ((nullcheck != 0) && ((long)sVar16 < (long)__nmemb_00)) {
                              do {
                                sVar17 = sVar16;
                                if (psVar28[sVar16] != nullvalue) break;
                                sVar16 = sVar16 + 1;
                                sVar17 = __nmemb_00;
                              } while (__nmemb_00 - sVar16 != 0);
                            }
                            if (sVar17 == __nmemb_00) {
                              uVar26 = uVar26 + 4;
                            }
                            else {
                              uVar3 = array[lVar18 + sVar17];
                              local_a4 = (uint)uVar3;
                              if ((short)uVar3 < (short)uVar23) {
                                uVar23 = (uint)uVar3;
                              }
                              uVar33 = local_a4;
                              if ((short)uVar3 <= (short)uVar35) {
                                uVar33 = uVar35;
                              }
                              uVar35 = uVar33;
                              sVar17 = sVar17 + 1;
                              sVar16 = sVar17;
                              if ((nullcheck != 0) && ((long)sVar17 < (long)__nmemb_00)) {
                                do {
                                  sVar16 = sVar17;
                                  if (psVar28[sVar17] != nullvalue) break;
                                  sVar17 = sVar17 + 1;
                                  sVar16 = __nmemb_00;
                                } while (__nmemb_00 - sVar17 != 0);
                              }
                              if (sVar16 == __nmemb_00) {
                                uVar26 = uVar26 + 5;
                              }
                              else {
                                uVar3 = array[lVar18 + sVar16];
                                local_a8 = (uint)uVar3;
                                if ((short)uVar3 < (short)uVar23) {
                                  uVar23 = (uint)uVar3;
                                }
                                uVar33 = local_a8;
                                if ((short)uVar3 <= (short)uVar35) {
                                  uVar33 = uVar35;
                                }
                                uVar35 = uVar33;
                                sVar16 = sVar16 + 1;
                                sVar17 = sVar16;
                                if ((nullcheck != 0) && ((long)sVar16 < (long)__nmemb_00)) {
                                  do {
                                    sVar17 = sVar16;
                                    if (psVar28[sVar16] != nullvalue) break;
                                    sVar16 = sVar16 + 1;
                                    sVar17 = __nmemb_00;
                                  } while (__nmemb_00 - sVar16 != 0);
                                }
                                if (sVar17 == __nmemb_00) {
                                  uVar26 = uVar26 + 6;
                                }
                                else {
                                  uVar3 = array[lVar18 + sVar17];
                                  if ((short)uVar3 < (short)uVar23) {
                                    uVar23 = (uint)uVar3;
                                  }
                                  uVar33 = (uint)uVar3;
                                  if ((short)uVar3 <= (short)uVar35) {
                                    uVar33 = uVar35;
                                  }
                                  uVar35 = uVar33;
                                  sVar17 = sVar17 + 1;
                                  sVar16 = sVar17;
                                  if ((nullcheck != 0) && ((long)sVar17 < (long)__nmemb_00)) {
                                    do {
                                      sVar16 = sVar17;
                                      if (psVar28[sVar17] != nullvalue) break;
                                      sVar17 = sVar17 + 1;
                                      sVar16 = __nmemb_00;
                                    } while (__nmemb_00 - sVar17 != 0);
                                  }
                                  if (sVar16 == __nmemb_00) {
                                    uVar26 = uVar26 + 7;
                                  }
                                  else {
                                    uVar4 = array[lVar18 + sVar16];
                                    lVar20 = uVar26 + 8;
                                    if ((short)uVar4 < (short)uVar23) {
                                      uVar23 = (uint)uVar4;
                                    }
                                    uVar33 = (uint)uVar4;
                                    if ((short)uVar4 <= (short)uVar35) {
                                      uVar33 = uVar35;
                                    }
                                    sVar16 = sVar16 + 1;
                                    uVar35 = uVar33;
                                    if ((long)sVar16 < (long)__nmemb_00) {
                                      local_88 = 0;
                                      local_60 = 0;
                                      uVar33 = (uint)uVar2;
                                      local_4c = (uint)uVar3;
                                      uVar31 = (uint)uVar4;
                                      uVar39 = (uint)uVar1;
                                      do {
                                        uVar25 = uVar33;
                                        uVar11 = local_a4;
                                        uVar10 = local_a8;
                                        uVar33 = local_c4;
                                        local_a4 = local_a8;
                                        local_a8 = local_4c;
                                        sVar17 = sVar16;
                                        if ((nullcheck != 0) && ((long)sVar16 < (long)__nmemb_00)) {
                                          do {
                                            sVar17 = sVar16;
                                            if (psVar28[sVar16] != nullvalue) break;
                                            sVar16 = sVar16 + 1;
                                            sVar17 = __nmemb_00;
                                          } while (__nmemb_00 - sVar16 != 0);
                                        }
                                        if (sVar17 == __nmemb_00) break;
                                        sVar34 = array[lVar18 + sVar17];
                                        uVar32 = (uint)sVar34;
                                        if (sVar34 < (short)uVar23) {
                                          uVar23 = uVar32;
                                        }
                                        if ((short)uVar35 < sVar34) {
                                          uVar35 = uVar32;
                                        }
                                        sVar24 = (short)uVar11;
                                        iVar36 = (int)sVar24;
                                        local_c4 = uVar11;
                                        sVar22 = (short)uVar10;
                                        sVar34 = (short)local_4c;
                                        if (sVar34 != sVar22 || sVar24 != sVar22) {
                                          iVar37 = iVar36 - sVar34;
                                          iVar12 = -iVar37;
                                          if (0 < iVar37) {
                                            iVar12 = iVar37;
                                          }
                                          *(int *)((long)pdVar14 + local_60 * 4) = iVar12;
                                          local_60 = local_60 + 1;
                                        }
                                        sVar8 = (short)uVar25;
                                        sVar9 = (short)uVar33;
                                        if (((sVar9 == sVar24 && sVar8 == sVar9) && sVar24 == sVar22
                                            ) && sVar34 == sVar22) {
                                          lVar20 = lVar20 + 1;
                                        }
                                        else {
                                          iVar37 = (int)sVar8 + (int)sVar34;
                                          iVar27 = iVar36 * 2 - iVar37;
                                          iVar12 = -iVar27;
                                          if (0 < iVar27) {
                                            iVar12 = iVar27;
                                          }
                                          *(int *)((long)arr + local_88 * 4) = iVar12;
                                          iVar12 = (int)(short)uVar19 + iVar36 * 6 + iVar37 * -4 +
                                                   uVar32;
                                          iVar36 = -iVar12;
                                          if (0 < iVar12) {
                                            iVar36 = iVar12;
                                          }
                                          *(int *)((long)arr_00 + local_88 * 4) = iVar36;
                                          local_88 = local_88 + 1;
                                        }
                                        sVar16 = sVar17 + 1;
                                        uVar19 = (ushort)uVar39;
                                        local_4c = uVar31;
                                        uVar31 = uVar32;
                                        uVar39 = uVar25;
                                      } while ((long)sVar16 < (long)__nmemb_00);
                                    }
                                    else {
                                      local_60 = 0;
                                      local_88 = 0;
                                    }
                                    uVar26 = lVar20 + local_88;
                                    if (local_88 != 0) {
                                      if (local_88 == 1) {
                                        if (local_60 == 1) {
                                          __ptr_00[local_a0] = (double)*(int *)pdVar14;
                                          local_a0 = local_a0 + 1;
                                        }
                                        __base[local_58] = (double)*(int *)arr;
                                        iVar36 = *(int *)arr_00;
                                      }
                                      else {
                                        iVar36 = (int)local_88;
                                        if (1 < local_60) {
                                          iVar12 = quick_select_int((int *)pdVar14,iVar36);
                                          __ptr_00[local_a0] = (double)iVar12;
                                          local_a0 = local_a0 + 1;
                                        }
                                        iVar12 = quick_select_int((int *)arr,iVar36);
                                        __base[local_58] = (double)iVar12;
                                        iVar36 = quick_select_int((int *)arr_00,iVar36);
                                      }
                                      __base_00[local_58] = (double)iVar36;
                                      local_58 = local_58 + 1;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    sVar34 = (short)uVar35;
                    sVar22 = (short)uVar23;
                    sVar30 = sVar30 + 1;
                    psVar28 = psVar28 + lVar29 * nx;
                    uVar33 = uVar35;
                  } while (sVar30 != __nmemb);
                }
                if (local_58 == 0) {
                  dVar41 = 0.0;
                  dStack_70 = 0.0;
                }
                else if (local_58 == 1) {
                  dVar41 = *__base;
                  dStack_70 = *__base_00;
                }
                else {
                  qsort(__base,local_58,8,FnCompare_double);
                  qsort(__base_00,local_58,8,FnCompare_double);
                  lVar29 = ((local_58 - ((long)(local_58 - 1) >> 0x3f)) - 1 & 0x3ffffffffffffffe) *
                           4;
                  lVar18 = (local_58 - ((long)local_58 >> 0x3f) & 0x3ffffffffffffffe) * 4;
                  dVar41 = (*(double *)((long)__base + lVar18) + *(double *)((long)__base + lVar29))
                           * 0.5;
                  dStack_70 = (*(double *)((long)__base_00 + lVar18) +
                              *(double *)((long)__base_00 + lVar29)) * 0.5;
                }
                if (local_a0 == 0) {
                  dVar42 = 0.0;
                }
                else if (local_a0 == 1) {
                  dVar42 = *__ptr_00;
                }
                else {
                  auVar6._8_4_ = SUB84(dStack_70,0);
                  auVar6._0_8_ = dVar41;
                  auVar6._12_4_ = (int)((ulong)dStack_70 >> 0x20);
                  qsort(__ptr_00,local_a0,8,FnCompare_double);
                  dStack_70 = auVar6._8_8_;
                  dVar42 = (*(double *)
                             ((long)__ptr_00 +
                             ((local_a0 - ((long)(local_a0 - 1) >> 0x3f)) - 1 & 0xfffffffffffffffe)
                             * 4) + *(double *)
                                     ((long)__ptr_00 +
                                     (local_a0 - ((long)local_a0 >> 0x3f) & 0xfffffffffffffffe) * 4)
                           ) * 0.5;
                }
                dVar42 = dVar42 * 1.0483579;
                dVar41 = dVar41 * 0.6052697;
                auVar5._8_4_ = SUB84(dStack_70 * 0.1772048,0);
                auVar5._0_8_ = dVar41;
                auVar5._12_4_ = (int)((ulong)(dStack_70 * 0.1772048) >> 0x20);
                free(__base_00);
                free(__base);
                free(__ptr_00);
                free(arr_00);
                free(arr);
                free(pdVar14);
                dStack_70 = auVar5._8_8_;
                goto LAB_001b510e;
              }
              free(pdVar14);
              free(arr);
              free(arr_00);
              free(__ptr_00);
              pdVar14 = __base;
            }
          }
        }
      }
      free(pdVar14);
    }
    *status = 0x71;
    dVar41 = 0.0;
    dStack_70 = 0.0;
    dVar42 = 0.0;
    sVar22 = 0;
    sVar34 = 0;
  }
LAB_001b510e:
  if (ngoodpix != (long *)0x0) {
    *ngoodpix = uVar26;
  }
  if (minvalue != (short *)0x0) {
    *minvalue = sVar22;
  }
  if (maxvalue != (short *)0x0) {
    *maxvalue = sVar34;
  }
  if (noise2 != (double *)0x0) {
    *noise2 = dVar42;
  }
  if (noise3 != (double *)0x0) {
    *noise3 = dVar41;
  }
  if (noise5 != (double *)0x0) {
    *noise5 = dStack_70;
  }
LAB_001b5153:
  return *status;
}

Assistant:

int fits_img_stats_short(short *array, /*  2 dimensional array of image pixels */
        long nx,            /* number of pixels in each row of the image */
	long ny,            /* number of rows in the image */
	                    /* (if this is a 3D image, then ny should be the */
			    /* product of the no. of rows times the no. of planes) */
	int nullcheck,      /* check for null values, if true */
	short nullvalue,    /* value of null pixels, if nullcheck is true */

   /* returned parameters (if the pointer is not null)  */
	long *ngoodpix,     /* number of non-null pixels in the image */
	short *minvalue,    /* returned minimum non-null value in the array */
	short *maxvalue,    /* returned maximum non-null value in the array */
	double *mean,       /* returned mean value of all non-null pixels */
	double *sigma,      /* returned R.M.S. value of all non-null pixels */
	double *noise1,     /* 1st order estimate of noise in image background level */
	double *noise2,     /* 2nd order estimate of noise in image background level */
	double *noise3,     /* 3rd order estimate of noise in image background level */
	double *noise5,     /* 5th order estimate of noise in image background level */
	int *status)        /* error status */

/*
    Compute statistics of the input short integer image.
*/
{
	long ngood;
	short minval = 0, maxval = 0;
	double xmean = 0., xsigma = 0., xnoise = 0., xnoise2 = 0., xnoise3 = 0., xnoise5 = 0.;

	/* need to calculate mean and/or sigma and/or limits? */
	if (mean || sigma ) {
		FnMeanSigma_short(array, nx * ny, nullcheck, nullvalue, 
			&ngood, &xmean, &xsigma, status);

	    if (ngoodpix) *ngoodpix = ngood;
	    if (mean)     *mean = xmean;
	    if (sigma)    *sigma = xsigma;
	}

	if (noise1) {
		FnNoise1_short(array, nx, ny, nullcheck, nullvalue, 
		  &xnoise, status);

		*noise1  = xnoise;
	}

	if (minvalue || maxvalue || noise3) {
		FnNoise5_short(array, nx, ny, nullcheck, nullvalue, 
			&ngood, &minval, &maxval, &xnoise2, &xnoise3, &xnoise5, status);

		if (ngoodpix) *ngoodpix = ngood;
		if (minvalue) *minvalue= minval;
		if (maxvalue) *maxvalue = maxval;
		if (noise2) *noise2  = xnoise2;
		if (noise3) *noise3  = xnoise3;
		if (noise5) *noise5  = xnoise5;
	}
	return(*status);
}